

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

void __thiscall kratos::AssertPropertyVisitor::visit(AssertPropertyVisitor *this,AssertBase *stmt)

{
  _func_int *p_Var1;
  Sequence *this_00;
  int iVar2;
  Generator *this_01;
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  undefined4 extraout_var;
  StmtException *this_02;
  iterator __begin4;
  undefined1 auVar3 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer pbVar4;
  pointer pbVar5;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_120 [8];
  shared_ptr<kratos::AssertPropertyStmt> property_stmt;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clk_ports;
  undefined1 local_b0 [8];
  shared_ptr<kratos::Port> clk;
  Var *src_var;
  shared_ptr<kratos::VarCasted> casted;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> clk_vars;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clks;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  
  iVar2 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])(stmt);
  if (iVar2 == 1) {
    Stmt::as<kratos::AssertPropertyStmt>((Stmt *)local_120);
    p_Var1 = *(_func_int **)((long)local_120 + 0xc0);
    if ((*(long *)(p_Var1 + 0x38) == 0) &&
       (this_00 = *(Sequence **)(p_Var1 + 0x20),
       (this_00->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) {
      casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = Stmt::generator_parent(&stmt->super_Stmt);
      Generator::get_ports_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8,this_01,Clock);
      pbVar4 = clk_ports.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)clk_ports.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)local_e8 == 0x20) {
        Generator::get_port((Generator *)
                            &clks.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)this_01);
        auStack_68 = (undefined1  [8])
                     clks.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Port*>
                  ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)
                   &casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Port **)auStack_68);
        if (children.
            super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     children.
                     super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else if (local_e8 !=
               (undefined1  [8])
               clk_ports.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
        auVar3 = local_e8;
        do {
          Generator::get_port((Generator *)
                              &clks.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)this_01)
          ;
          auStack_68 = (undefined1  [8])
                       clks.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Port*>
                    ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)
                     &casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Port **)auStack_68);
          if (children.
              super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       children.
                       super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          auVar3 = (undefined1  [8])((long)auVar3 + 0x20);
        } while (auVar3 != (undefined1  [8])pbVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8);
      if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Generator::get_child_generators
                  ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)&clks.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this_01);
        for (pbVar4 = clks.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pbVar4 != (pointer)children.
                               super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
            pbVar4 = (pointer)&pbVar4->field_2) {
          Generator::get_ports_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_68,(Generator *)(pbVar4->_M_dataplus)._M_p,Clock);
          property_stmt.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               clks.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          auVar3 = auStack_68;
          if (auStack_68 !=
              (undefined1  [8])
              clks.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              Generator::get_port((Generator *)local_b0,(string *)(pbVar4->_M_dataplus)._M_p);
              __ht = (_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(**(code **)(*(long *)local_b0 + 0x80))();
              local_e8 = (undefined1  [8])0x0;
              clk_ports.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)__ht->_M_bucket_count;
              clk_ports.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              clk_ports.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__ht->_M_element_count;
              src_var = (Var *)local_e8;
              std::
              _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_assign<std::_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<kratos::AssignStmt>,false>>>>
                        ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_e8,__ht,
                         (_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<kratos::AssignStmt>,_false>_>_>
                          *)&src_var);
              for (pbVar5 = clk_ports.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pbVar5 != (pointer)0x0;
                  pbVar5 = (pointer)(pbVar5->_M_dataplus)._M_p) {
                clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      (pbVar5->_M_string_length + 200);
                iVar2 = (*(clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base[0xd])();
                if (((Generator *)CONCAT44(extraout_var,iVar2) == this_01) &&
                   (clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi[0x16]._M_use_count == 6)) {
                  Var::as<kratos::VarCasted>((Var *)&src_var);
                  if (*(int *)&src_var[1].super_IRNode.fn_name_ln.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish == 2) {
                    std::vector<kratos::Var*,std::allocator<kratos::Var*>>::
                    emplace_back<kratos::Var*&>
                              ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)
                               &casted.
                                super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,
                               (Var **)&clk.
                                        super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                  }
                  if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               casted.
                               super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
                  }
                }
              }
              std::
              _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_e8);
              if (clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              }
              auVar3 = (undefined1  [8])&(((Port *)auVar3)->super_Var).super_IRNode.verilog_ln;
            } while (auVar3 != (undefined1  [8])
                               property_stmt.
                               super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_68);
        }
        std::
        vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)&clks.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&uRamfffffffffffffff8) {
        this_02 = (StmtException *)__cxa_allocate_exception(0x10);
        Sequence::to_string_abi_cxx11_
                  ((string *)
                   &clks.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
        auStack_68 = (undefined1  [8])
                     clks.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x23;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_68;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_e8,(detail *)"Clock edge not set for sequence {0}",format_str,
                   args);
        __l._M_len = 1;
        __l._M_array = (iterator)local_b0;
        local_b0 = (undefined1  [8])stmt;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_68,__l,
                   (allocator_type *)&src_var);
        StmtException::StmtException
                  (this_02,(string *)local_e8,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_68);
        __cxa_throw(this_02,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      *(undefined8 *)(p_Var1 + 0x38) = uRamfffffffffffffff8;
      *(undefined8 *)(p_Var1 + 0x40) = 1;
      operator_delete(&uRamfffffffffffffff8,8);
    }
    if (property_stmt.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 property_stmt.
                 super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return;
}

Assistant:

void visit(AssertBase* stmt) override {
        if (stmt->assert_type() != AssertType::AssertProperty) {
            return;
        }
        auto property_stmt = stmt->as<AssertPropertyStmt>();
        auto* property = property_stmt->property();

        auto& edge = property->edge();
        auto* seq = property->sequence();
        // automatically determine the clock, only if it's safe to do so (only one clock in the
        // design
        if (!edge.var && seq->next()) {
            std::vector<Var*> clk_vars;
            // try to determine the clock
            // it's a concurrent property, we have to have a clock
            auto* generator = stmt->generator_parent();
            {
                auto clk_ports = generator->get_ports(PortType::Clock);
                if (clk_ports.size() == 1) {
                    // that's it
                    clk_vars.emplace_back(generator->get_port(clk_ports.front()).get());
                } else {
                    for (auto const& port_name : clk_ports) {
                        clk_vars.emplace_back(generator->get_port(port_name).get());
                    }
                }
            }
            if (clk_vars.empty()) {
                // there might be some casted types, typically in test bench
                // we need to source for connected modules to see what they are connected to
                auto children = generator->get_child_generators();
                for (auto const& gen : children) {
                    auto clks = gen->get_ports(PortType::Clock);
                    for (auto const& clk_name : clks) {
                        auto clk = gen->get_port(clk_name);
                        auto source = clk->sources();
                        for (auto const& assign : source) {
                            auto* src_var = assign->right();
                            if (src_var->generator() == generator) {
                                if (src_var->type() == VarType::BaseCasted) {
                                    // only casted to clock
                                    auto casted = src_var->as<VarCasted>();
                                    if (casted->cast_type() == VarCastType::Clock)
                                        clk_vars.emplace_back(src_var);
                                }
                            }
                        }
                    }
                }
            }

            if (clk_vars.size() == 1) {
                edge.var = clk_vars[0];
                edge.edge = EventEdgeType::Posedge;
                edge.type = EventControlType::Edge;
            } else {
                // next is not null but edge is not set
                throw StmtException(
                    ::format("Clock edge not set for sequence {0}", seq->to_string()), {stmt});
            }
        }
    }